

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_SwapFieldsAllOnArenaHeap_Test::
~GeneratedMessageReflectionTest_SwapFieldsAllOnArenaHeap_Test
          (GeneratedMessageReflectionTest_SwapFieldsAllOnArenaHeap_Test *this)

{
  GeneratedMessageReflectionTest_SwapFieldsAllOnArenaHeap_Test *this_local;
  
  ~GeneratedMessageReflectionTest_SwapFieldsAllOnArenaHeap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SwapFieldsAllOnArenaHeap) {
  Arena arena;
  auto* message1 = Arena::Create<unittest::TestAllTypes>(&arena);
  std::unique_ptr<unittest::TestAllTypes> message2(
      Arena::Create<unittest::TestAllTypes>(nullptr));

  TestUtil::SetAllFields(message2.get());

  std::vector<const FieldDescriptor*> fields;
  const Reflection* reflection = message1->GetReflection();
  reflection->ListFields(*message2, &fields);
  reflection->SwapFields(message1, message2.get(), fields);

  TestUtil::ExpectAllFieldsSet(*message1);
  TestUtil::ExpectClear(*message2);
}